

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O0

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
Curve<3,_2>::sampleWithArcLengthParameterized
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,Curve<3,_2> *this,double *delta,bool arc_length_base,
          int *max_iter_time,vector<double,_std::allocator<double>_> *arc_length_t)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *this_00;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *other;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar6;
  double dVar7;
  RealScalar RVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double local_1e8;
  undefined4 local_1bc;
  Matrix<double,_2,_1,_0,_2,_1> local_1b8;
  double local_1a0;
  double denominator;
  double numerator;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_188 [16];
  RealScalar local_178;
  double second_order;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_168 [16];
  RealScalar local_158;
  double first_order;
  double dStack_148;
  int j_1;
  double offset;
  int local_128;
  int local_124;
  int j;
  int iter;
  double prev_offset;
  undefined4 local_10c;
  Matrix<double,_2,_1,_0,_2,_1> local_108;
  int local_f8;
  undefined4 local_f4;
  int i;
  Matrix<double,_2,_1,_0,_2,_1> local_e8;
  undefined4 local_d4;
  undefined8 local_d0;
  Matrix<double,_2,_1,_0,_2,_1> local_c8;
  allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_ab;
  undefined1 local_aa;
  allocator<double> local_a9;
  value_type_conflict1 local_a8;
  undefined1 local_a0 [8];
  vector<double,_std::allocator<double>_> dists;
  allocator<double> local_71;
  value_type_conflict1 local_70;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> t_array;
  int n;
  double avg_t;
  double avg_distance;
  vector<double,_std::allocator<double>_> *arc_length_t_local;
  int *max_iter_time_local;
  bool arc_length_base_local;
  double *delta_local;
  Curve<3,_2> *this_local;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *ret;
  
  if (arc_length_base) {
    dVar6 = *delta;
    local_1e8 = dVar6 / this->length_;
  }
  else {
    dVar6 = this->length_ * *delta;
    local_1e8 = *delta;
  }
  bVar1 = false;
  if (0.0 <= dVar6) {
    bVar1 = dVar6 <= this->length_ / 2.0;
  }
  if (!bVar1) {
    __assert_fail("avg_distance >= 0 && avg_distance <= this->length_ / 2.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                  ,0x6b,
                  "virtual vector<PointType> Curve<>::sampleWithArcLengthParameterized(const double &, bool, const int &, vector<double> *) [N = 3, PointDim = 2]"
                 );
  }
  t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)(this->length_ / dVar6);
  sVar3 = (size_type)
          t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  local_70 = 0.0;
  std::allocator<double>::allocator(&local_71);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,sVar3,&local_70,&local_71);
  std::allocator<double>::~allocator(&local_71);
  sVar3 = (size_type)
          t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  local_a8 = 0.0;
  std::allocator<double>::allocator(&local_a9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0,sVar3,&local_a8,&local_a9);
  std::allocator<double>::~allocator(&local_a9);
  local_aa = 0;
  iVar2 = t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::allocator(&local_ab);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector(__return_storage_ptr__,(long)iVar2,&local_ab);
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~allocator(&local_ab);
  local_d0 = 0;
  local_d4 = 0;
  (*this->_vptr_Curve[2])(&local_c8,this,&local_d0,&local_d4);
  pvVar4 = std::
           vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           ::front(__return_storage_ptr__);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(pvVar4,&local_c8);
  _i = 0x3ff0000000000000;
  local_f4 = 0;
  (*this->_vptr_Curve[2])(&local_e8,this,&i,&local_f4);
  pvVar4 = std::
           vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           ::back(__return_storage_ptr__);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(pvVar4,&local_e8);
  for (local_f8 = 1;
      local_f8 <
      t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_f8 = local_f8 + 1) {
    dVar7 = (double)local_f8;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,(long)local_f8);
    *pvVar5 = dVar7 * local_1e8;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,(long)local_f8);
    local_10c = 0;
    (*this->_vptr_Curve[2])(&local_108,this,pvVar5,&local_10c);
    pvVar4 = std::
             vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ::operator[](__return_storage_ptr__,(long)local_f8);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(pvVar4,&local_108);
  }
  prev_offset = 1.0;
  this_01 = (vector<double,_std::allocator<double>_> *)local_68;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&prev_offset);
  _j = -1.0;
  for (local_124 = 0; local_124 < *max_iter_time; local_124 = local_124 + 1) {
    for (local_128 = 1;
        local_128 <
        t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_128 = local_128 + 1) {
      this_00 = (MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)
                std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[](__return_storage_ptr__,(long)local_128);
      other = (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
              std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::operator[](__return_storage_ptr__,(long)(local_128 + -1));
      Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                  *)&offset,this_00,other);
      RVar8 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      *)&offset);
      this_01 = (vector<double,_std::allocator<double>_> *)local_a0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_128);
      *pvVar5 = RVar8;
    }
    dStack_148 = 0.0;
    for (first_order._4_4_ = 1;
        first_order._4_4_ <
        t_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; first_order._4_4_ = first_order._4_4_ + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,
                          (long)first_order._4_4_);
      dStack_148 = dStack_148 + (*pvVar5 - dVar6);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,
                          (long)first_order._4_4_);
      second_order._4_4_ = 1;
      (*this->_vptr_Curve[2])(local_168,this,pvVar5,(long)&second_order + 4);
      local_158 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm(local_168);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,
                          (long)first_order._4_4_);
      numerator._4_4_ = 2;
      (*this->_vptr_Curve[2])(local_188,this,pvVar5,(long)&numerator + 4);
      local_178 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm(local_188);
      denominator = dStack_148 * local_158;
      local_1a0 = dStack_148 * local_178 + local_158 * local_158;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,
                          (long)first_order._4_4_);
      dVar7 = *pvVar5;
      dVar9 = denominator / local_1a0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,
                          (long)first_order._4_4_);
      *pvVar5 = dVar7 - dVar9;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,
                          (long)first_order._4_4_);
      local_1bc = 0;
      (*this->_vptr_Curve[2])(&local_1b8,this,pvVar5,&local_1bc);
      this_01 = (vector<double,_std::allocator<double>_> *)
                std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[](__return_storage_ptr__,(long)first_order._4_4_);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
                ((Matrix<double,_2,_1,_0,_2,_1> *)this_01,&local_1b8);
    }
    if ((dStack_148 < 1e-06) || (std::abs((int)this_01), extraout_XMM0_Qa < 1e-06)) break;
    _j = dStack_148;
  }
  if (arc_length_t != (vector<double,_std::allocator<double>_> *)0x0) {
    std::vector<double,_std::allocator<double>_>::swap
              (arc_length_t,(vector<double,_std::allocator<double>_> *)local_68);
  }
  local_aa = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual auto sampleWithArcLengthParameterized(const double& delta,
                                                bool arc_length_base = true,
                                                const int& max_iter_time = 4,
                                                vector<double>* arc_length_t = nullptr)
      -> vector<PointType> {
    const double avg_distance = arc_length_base ? delta : this->length_ * delta;

    const double avg_t = arc_length_base ? avg_distance / this->length_ : delta;

    assert(avg_distance >= 0 && avg_distance <= this->length_ / 2.0);

    const int n(this->length_ / avg_distance);

    vector<double> t_array(n, 0);
    vector<double> dists(n, 0);
    vector<PointType> ret(n + 1);  // 实际上总共有 n+1 个点
    ret.front() = this->at(0.0);
    ret.back() = this->at(1.0);

    // 第一个点与最后一个点保持在开始与结尾处
    for (int i = 1; i < n; ++i) {
      t_array[i] = i * avg_t;
      ret[i] = this->at(t_array[i]);
    }
    t_array.emplace_back(1.0);

    double prev_offset = -1;

    for (int iter = 0; iter < max_iter_time; ++iter) {
      // 1. 计算上一次迭代确定的 t 参数下，每一个分段的近似长度
      for (int j = 1; j < n; j++) {
        dists[j] = (ret[j] - ret[j - 1]).norm();
      }

      double offset = 0;
      for (int j = 1; j < n; j++) {
        // 2. 累计近似弧长并计算误差
        offset += dists[j] - avg_distance;

        // 3. Newton's method
        double first_order = this->at(t_array[j], 1).norm();
        double second_order = this->at(t_array[j], 2).norm();
        double numerator = offset * first_order;
        double denominator = offset * second_order + first_order * first_order;

        t_array[j] = t_array[j] - numerator / denominator;

        ret[j] = this->at(t_array[j]);
      }

      if (offset < EPS || abs(offset - prev_offset) < EPS) {
        break;
      }
      prev_offset = offset;
    }

    if (arc_length_t != nullptr) {
      arc_length_t->swap(t_array);
    }

    return ret;
  }